

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

int ffgtrmr(fitsfile *gfptr,HDUtracker *HDU,int *status)

{
  int iVar1;
  ulong member;
  fitsfile *mfptr;
  long nmembers;
  int hdutype;
  char keyvalue [71];
  char comment [73];
  
  nmembers = 0;
  mfptr = (fitsfile *)0x0;
  iVar1 = *status;
  if (iVar1 == 0) {
    iVar1 = ffgtnm(gfptr,&nmembers,status);
    *status = iVar1;
    member = nmembers & 0xffffffff;
    while ((0 < (int)member && (iVar1 == 0))) {
      iVar1 = ffgmop(gfptr,member,&mfptr,status);
      *status = iVar1;
      if (iVar1 == 0) {
        iVar1 = fftsad(mfptr,HDU,(int *)0x0,(char *)0x0);
        *status = iVar1;
        if (iVar1 == 0) {
          iVar1 = ffgkys(mfptr,"EXTNAME",keyvalue,comment,status);
          *status = iVar1;
          if (iVar1 == 0xca) {
            *status = 0;
            keyvalue[0] = '\0';
            iVar1 = 0;
          }
          prepare_keyvalue(keyvalue);
          if (iVar1 == 0) {
            iVar1 = fits_strcasecmp(keyvalue,"GROUPING");
            if (iVar1 == 0) {
              iVar1 = ffgtrmr(mfptr,HDU,status);
              *status = iVar1;
            }
            iVar1 = ffghdn(mfptr,&hdutype);
            if (iVar1 == 1) {
              iVar1 = ffgmul(mfptr,1,status);
            }
            else {
              iVar1 = ffgmul(mfptr,0,status);
              *status = iVar1;
              iVar1 = ffdhdu(mfptr,&hdutype,status);
            }
            *status = iVar1;
            goto LAB_001678c8;
          }
        }
        else if (iVar1 == 0x15a) {
          *status = 0;
LAB_001678c8:
          ffclos(mfptr,status);
        }
      }
      else if (iVar1 == 0x156) {
        *status = 0;
      }
      member = member - 1;
      iVar1 = *status;
    }
  }
  return iVar1;
}

Assistant:

int ffgtrmr(fitsfile   *gfptr,  /* FITS file pointer to group               */
	    HDUtracker *HDU,    /* list of processed HDUs                   */
	    int        *status) /* return status code                       */
	    
/*
  recursively remove a grouping table and all its members. Each member of
  the grouping table pointed to by gfptr it processed. If the member is itself
  a grouping table then ffgtrmr() is recursively called to process all
  of its members. The HDUtracker struct *HDU is used to make sure a member
  is not processed twice, thus avoiding an infinite loop (e.g., a grouping
  table contains itself as a member).
*/

{
  int i;
  int hdutype;

  long nmembers = 0;

  char keyvalue[FLEN_VALUE];
  char comment[FLEN_COMMENT];
  
  fitsfile *mfptr = NULL;


  if(*status != 0) return(*status);

  /* get the number of members contained by this grouping table */

  *status = fits_get_num_members(gfptr,&nmembers,status);

  /* loop over all group members and delete them */

  for(i = nmembers; i > 0 && *status == 0; --i)
    {
      /* open the member HDU */

      *status = fits_open_member(gfptr,i,&mfptr,status);

      /* if the member cannot be opened then just skip it and continue */

      if(*status == MEMBER_NOT_FOUND) 
	{
	  *status = 0;
	  continue;
	}

      /* Any other error is a reason to abort */
      
      if(*status != 0) continue;

      /* add the member HDU to the HDUtracker struct */

      *status = fftsad(mfptr,HDU,NULL,NULL);

      /* status == HDU_ALREADY_TRACKED ==> HDU has already been processed */

      if(*status == HDU_ALREADY_TRACKED) 
	{
	  *status = 0;
	  fits_close_file(mfptr,status);
	  continue;
	}
      else if(*status != 0) continue;

      /* determine if the member HDU is itself a grouping table */

      *status = fits_read_key_str(mfptr,"EXTNAME",keyvalue,comment,status);

      /* if no EXTNAME is found then the HDU cannot be a grouping table */ 

      if(*status == KEY_NO_EXIST) 
	{
	  *status     = 0;
	  keyvalue[0] = 0;
	}
      prepare_keyvalue(keyvalue);

      /* Any other error is a reason to abort */
      
      if(*status != 0) continue;

      /* 
	 if the EXTNAME == GROUPING then the member is a grouping table 
	 and we must call ffgtrmr() to process its members
      */

      if(fits_strcasecmp(keyvalue,"GROUPING") == 0)
	  *status = ffgtrmr(mfptr,HDU,status);  

      /* 
	 unlink all the grouping tables that contain this HDU as a member 
	 and then delete the HDU (if not a PHDU)
      */

      if(fits_get_hdu_num(mfptr,&hdutype) == 1)
	      *status = ffgmul(mfptr,1,status);
      else
	  {
	      *status = ffgmul(mfptr,0,status);
	      *status = fits_delete_hdu(mfptr,&hdutype,status);
	  }

      /* close the fitsfile pointer */

      fits_close_file(mfptr,status);
    }

  return(*status);
}